

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void setupCornellBox(World *world)

{
  pointer __p;
  Sampler *pSVar1;
  Matte *pMVar2;
  Rectangle *pRVar3;
  pointer *__ptr;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short4;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short3;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short2;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short1;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall2;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall1;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short5;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall3;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall5;
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall4;
  Geometry *local_278;
  float local_270;
  Geometry *local_268;
  float local_260;
  Geometry *local_258;
  float local_250;
  Geometry *local_248;
  float local_240;
  Geometry *local_238;
  Geometry *local_230;
  Geometry *local_228;
  _Head_base<0UL,_pm::Geometry_*,_false> local_220;
  _Head_base<0UL,_pm::Geometry_*,_false> local_218;
  _Head_base<0UL,_pm::Geometry_*,_false> local_210;
  Geometry *local_208;
  _Head_base<0UL,_pm::Geometry_*,_false> local_200;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1f8;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1f0;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1e8;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1e0;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1d8;
  _Head_base<0UL,_pm::Geometry_*,_false> local_1d0;
  Geometry *local_1c8;
  Geometry *local_1c0;
  Matte *local_1b8;
  Emissive *local_1b0;
  Matte *local_1a8;
  Matte *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  Vector3 local_18c;
  Vector3 local_180;
  undefined8 local_174;
  undefined4 local_16c;
  Vector3 local_168;
  Vector3 local_15c;
  undefined8 local_150;
  undefined4 local_148;
  Vector3 local_144;
  Vector3 local_138;
  undefined8 local_12c;
  undefined4 local_124;
  Vector3 local_120;
  Vector3 local_114;
  undefined8 local_108;
  undefined4 local_100;
  Vector3 local_fc;
  Vector3 local_f0;
  undefined8 local_e4;
  undefined4 local_dc;
  Vector3 local_d8;
  Vector3 local_cc;
  undefined8 local_c0;
  undefined4 local_b8;
  Vector3 local_b4;
  Vector3 local_a8;
  undefined8 local_9c;
  undefined4 local_94;
  Vector3 local_90;
  Vector3 local_84;
  undefined8 local_78;
  undefined4 local_70;
  Vector3 local_6c;
  Vector3 local_60;
  undefined8 local_54;
  undefined4 local_4c;
  Vector3 local_48;
  Vector3 local_3c;
  
  local_248._0_4_ = 1.26117e-44;
  pSVar1 = &pm::World::createSampler<pm::MultiJittered,int>(world,(int *)&local_248)->super_Sampler;
  (world->viewplane_).width_ = 0x500;
  (world->viewplane_).height_ = 0x2d0;
  (world->viewplane_).samplerState_.sampler_ = pSVar1;
  (world->viewplane_).maxDepth_ = 5;
  local_248 = (Geometry *)CONCAT44(local_248._4_4_,3.58732e-43);
  pSVar1 = &pm::World::createSampler<pm::Hammersley,int>(world,(int *)&local_248)->super_Sampler;
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_1b8 = pMVar2;
  pm::Matte::setCd(pMVar2,0.7,0.7,0.7);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_1a0 = pMVar2;
  pm::Matte::setCd(pMVar2,0.7,0.0,0.0);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_1a8 = pMVar2;
  pm::Matte::setCd(pMVar2,0.0,0.7,0.0);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  local_1b0 = pm::World::createMaterial<pm::Emissive>(world);
  local_248 = (Geometry *)0x4409328f43550000;
  local_240 = 227.0;
  local_258 = (Geometry *)0x43020000;
  local_250 = 0.0;
  local_268 = (Geometry *)0x0;
  local_260 = 105.0;
  local_278 = (Geometry *)0xbf80000000000000;
  local_270 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  (pRVar3->samplerState_).sampler_ = pSVar1;
  (pRVar3->super_Geometry).material_ = &local_1b0->super_Material;
  local_248 = (Geometry *)0x0;
  local_240 = 0.0;
  local_258 = (Geometry *)0x440a3333;
  local_250 = 0.0;
  local_268 = (Geometry *)0x0;
  local_260 = 559.2;
  local_278 = (Geometry *)0x3f80000000000000;
  local_270 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  pMVar2 = local_1b8;
  (pRVar3->super_Geometry).material_ = &local_1b8->super_Material;
  local_248 = (Geometry *)&DAT_4409333300000000;
  local_240 = 0.0;
  local_258 = (Geometry *)&DAT_440b0000;
  local_250 = 0.0;
  local_268 = (Geometry *)0x0;
  local_260 = 559.2;
  local_278 = (Geometry *)0xbf80000000000000;
  local_270 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  (pRVar3->super_Geometry).material_ = &pMVar2->super_Material;
  local_248 = (Geometry *)0x440a3333;
  local_240 = 0.0;
  local_258 = (Geometry *)&DAT_4409333300000000;
  local_250 = 0.0;
  local_268 = (Geometry *)0x0;
  local_260 = 559.2;
  local_278 = (Geometry *)0xbf800000;
  local_270 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  (pRVar3->super_Geometry).material_ = &local_1a0->super_Material;
  local_248 = (Geometry *)0x0;
  local_240 = 0.0;
  local_258 = (Geometry *)&DAT_4409333300000000;
  local_250 = 0.0;
  local_268 = (Geometry *)0x0;
  local_260 = 559.2;
  local_278 = (Geometry *)0x3f800000;
  local_270 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  (pRVar3->super_Geometry).material_ = &local_1a8->super_Material;
  local_248 = (Geometry *)0x0;
  local_240 = 559.2;
  local_258 = (Geometry *)&DAT_4409333300000000;
  local_250 = 0.0;
  local_268 = (Geometry *)&DAT_440b0000;
  local_260 = 0.0;
  local_278 = (Geometry *)0x0;
  local_270 = -1.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,(Vector3 *)&local_248,(Vector3 *)&local_258,(Vector3 *)&local_268,
                      (Vector3 *)&local_278);
  pMVar2 = local_1b8;
  (pRVar3->super_Geometry).material_ = &local_1b8->super_Material;
  local_3c.x = 130.0;
  local_3c.y = 165.0;
  local_3c.z = 65.0;
  local_48.x = 82.0;
  local_48.y = 165.0;
  local_48.z = 225.0;
  local_54 = 0x4325000043910000;
  local_4c = 0x42e40000;
  rectangleFromVertices((Vector3 *)&local_248,&local_3c,&local_48);
  local_1d0._M_head_impl = local_248;
  local_248->material_ = &pMVar2->super_Material;
  local_248 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1d0);
  if (local_1d0._M_head_impl != (Geometry *)0x0) {
    (*(local_1d0._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1d0._M_head_impl = (Geometry *)0x0;
  local_60.x = 290.0;
  local_60.y = 0.0;
  local_60.z = 114.0;
  local_6c.x = 290.0;
  local_6c.y = 165.0;
  local_6c.z = 114.0;
  local_78 = 0x43700000;
  local_70 = 0x43880000;
  rectangleFromVertices((Vector3 *)&local_258,&local_60,&local_6c);
  local_1d8._M_head_impl = local_258;
  local_258->material_ = &pMVar2->super_Material;
  local_258 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1d8);
  if (local_1d8._M_head_impl != (Geometry *)0x0) {
    (*(local_1d8._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1d8._M_head_impl = (Geometry *)0x0;
  local_84.x = 130.0;
  local_84.y = 0.0;
  local_84.z = 65.0;
  local_90.x = 130.0;
  local_90.y = 165.0;
  local_90.z = 65.0;
  local_9c = 0x43910000;
  local_94 = 0x42e40000;
  rectangleFromVertices((Vector3 *)&local_268,&local_84,&local_90);
  local_1e0._M_head_impl = local_268;
  local_268->material_ = &pMVar2->super_Material;
  local_268 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1e0);
  if (local_1e0._M_head_impl != (Geometry *)0x0) {
    (*(local_1e0._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1e0._M_head_impl = (Geometry *)0x0;
  local_a8.x = 82.0;
  local_a8.y = 0.0;
  local_a8.z = 225.0;
  local_b4.x = 82.0;
  local_b4.y = 165.0;
  local_b4.z = 225.0;
  local_c0 = 0x43020000;
  local_b8 = 0x42820000;
  rectangleFromVertices((Vector3 *)&local_278,&local_a8,&local_b4);
  local_1e8._M_head_impl = local_278;
  local_278->material_ = &pMVar2->super_Material;
  local_278 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1e8);
  if (local_1e8._M_head_impl != (Geometry *)0x0) {
    (*(local_1e8._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1e8._M_head_impl = (Geometry *)0x0;
  local_cc.x = 240.0;
  local_cc.y = 0.0;
  local_cc.z = 272.0;
  local_d8.x = 240.0;
  local_d8.y = 165.0;
  local_d8.z = 272.0;
  local_e4 = 0x42a40000;
  local_dc = 0x43610000;
  rectangleFromVertices((Vector3 *)&local_228,&local_cc,&local_d8);
  local_1f0._M_head_impl = local_228;
  local_228->material_ = &pMVar2->super_Material;
  local_228 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1f0);
  if (local_1f0._M_head_impl != (Geometry *)0x0) {
    (*(local_1f0._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1f0._M_head_impl = (Geometry *)0x0;
  local_f0.x = 423.0;
  local_f0.y = 330.0;
  local_f0.z = 247.0;
  local_fc.x = 265.0;
  local_fc.y = 330.0;
  local_fc.z = 296.0;
  local_108 = 0x43a5000043ec0000;
  local_100 = 0x43cb0000;
  rectangleFromVertices((Vector3 *)&local_230,&local_f0,&local_fc);
  local_1f8._M_head_impl = local_230;
  local_230->material_ = &pMVar2->super_Material;
  local_230 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_1f8);
  if (local_1f8._M_head_impl != (Geometry *)0x0) {
    (*(local_1f8._M_head_impl)->_vptr_Geometry[1])();
  }
  local_1f8._M_head_impl = (Geometry *)0x0;
  local_114.x = 423.0;
  local_114.y = 0.0;
  local_114.z = 247.0;
  local_120.x = 423.0;
  local_120.y = 330.0;
  local_120.z = 247.0;
  local_12c = 0x43ec0000;
  local_124 = 0x43cb0000;
  rectangleFromVertices((Vector3 *)&local_238,&local_114,&local_120);
  local_200._M_head_impl = local_238;
  local_238->material_ = &pMVar2->super_Material;
  local_238 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_200);
  if (local_200._M_head_impl != (Geometry *)0x0) {
    (*(local_200._M_head_impl)->_vptr_Geometry[1])();
  }
  local_200._M_head_impl = (Geometry *)0x0;
  local_138.x = 472.0;
  local_138.y = 0.0;
  local_138.z = 406.0;
  local_144.x = 472.0;
  local_144.y = 330.0;
  local_144.z = 406.0;
  local_150 = 0x439d0000;
  local_148 = 0x43e40000;
  rectangleFromVertices((Vector3 *)&local_208,&local_138,&local_144);
  local_210._M_head_impl = local_208;
  local_208->material_ = &pMVar2->super_Material;
  local_208 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_210);
  if (local_210._M_head_impl != (Geometry *)0x0) {
    (*(local_210._M_head_impl)->_vptr_Geometry[1])();
  }
  local_210._M_head_impl = (Geometry *)0x0;
  local_15c.x = 314.0;
  local_15c.y = 0.0;
  local_15c.z = 456.0;
  local_168.x = 314.0;
  local_168.y = 330.0;
  local_168.z = 456.0;
  local_174 = 0x43848000;
  local_16c = 0x43940000;
  rectangleFromVertices((Vector3 *)&local_1c0,&local_15c,&local_168);
  local_218._M_head_impl = local_1c0;
  local_1c0->material_ = &pMVar2->super_Material;
  local_1c0 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_218);
  if (local_218._M_head_impl != (Geometry *)0x0) {
    (*(local_218._M_head_impl)->_vptr_Geometry[1])();
  }
  local_218._M_head_impl = (Geometry *)0x0;
  local_180.x = 265.0;
  local_180.y = 0.0;
  local_180.z = 296.0;
  local_18c.x = 265.0;
  local_18c.y = 330.0;
  local_18c.z = 296.0;
  local_198 = 0x43d38000;
  local_190 = 0x43770000;
  rectangleFromVertices((Vector3 *)&local_1c8,&local_180,&local_18c);
  local_220._M_head_impl = local_1c8;
  local_1c8->material_ = &pMVar2->super_Material;
  local_1c8 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_220);
  if (local_220._M_head_impl != (Geometry *)0x0) {
    (*(local_220._M_head_impl)->_vptr_Geometry[1])();
  }
  local_220._M_head_impl = (Geometry *)0x0;
  if (local_238 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_238 + 8))();
  }
  if (local_230 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_230 + 8))();
  }
  if (local_228 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_228 + 8))();
  }
  if (local_278 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_278 + 8))();
  }
  if (local_268 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_268 + 8))();
  }
  if (local_258 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_258 + 8))();
  }
  if (local_248 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_248 + 8))();
  }
  return;
}

Assistant:

void setupCornellBox(pm::World &world)
{
	auto vpSampler = world.createSampler<pm::MultiJittered>(9);

	world.viewPlane().setDimensions(Width, Height);
	world.viewPlane().setSampler(vpSampler);
	world.viewPlane().editMaxDepth() = 5;

	auto hammersley = world.createSampler<pm::Hammersley>(256);

	// Materials
	auto white = world.createMaterial<pm::Matte>();
	white->setCd(0.7f, 0.7f, 0.7f);
	white->ambient().setSampler(hammersley);
	white->diffuse().setSampler(hammersley);

	auto red = world.createMaterial<pm::Matte>();
	red->setCd(0.7f, 0.0f, 0.0f);
	red->ambient().setSampler(hammersley);
	red->diffuse().setSampler(hammersley);

	auto green = world.createMaterial<pm::Matte>();
	green->setCd(0.0f, 0.7f, 0.0f);
	green->ambient().setSampler(hammersley);
	green->diffuse().setSampler(hammersley);

	auto emissive = world.createMaterial<pm::Emissive>();

	// Light
	auto lightRect = world.createObject<pm::Rectangle>(pm::Vector3(213.0f, 548.79f, 227.0f), pm::Vector3(343.0f - 213.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 332.0f - 227.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	lightRect->setSampler(hammersley);
	lightRect->setMaterial(emissive);

	// Walls
	auto floor = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 1.0f, 0.0f));
	floor->setMaterial(white);

	auto ceiling = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, -1.0f, 0.0f));
	ceiling->setMaterial(white);

	auto leftWall = world.createObject<pm::Rectangle>(pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(-1.0f, 0.0f, 0.0f));
	leftWall->setMaterial(red);

	auto rightWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(1.0f, 0.0f, 0.0f));
	rightWall->setMaterial(green);

	auto backWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, -1.0f));
	backWall->setMaterial(white);

	// Short object
	auto short1 = rectangleFromVertices(pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(290.0f, 165.0f, 114.0f));
	short1->setMaterial(white);
	world.addObject(std::move(short1));

	auto short2 = rectangleFromVertices(pm::Vector3(290.0f, 0.0f, 114.0f), pm::Vector3(290.0f, 165.0f, 114.0f), pm::Vector3(240.0f, 0.0f, 272.0f));
	short2->setMaterial(white);
	world.addObject(std::move(short2));

	auto short3 = rectangleFromVertices(pm::Vector3(130.0f, 0.0f, 65.0f), pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(290.0f, 0.0f, 114.0f));
	short3->setMaterial(white);
	world.addObject(std::move(short3));

	auto short4 = rectangleFromVertices(pm::Vector3(82.0f, 0.0f, 225.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(130.0f, 0.0f, 65.0f));
	short4->setMaterial(white);
	world.addObject(std::move(short4));

	auto short5 = rectangleFromVertices(pm::Vector3(240.0f, 0.0f, 272.0f), pm::Vector3(240.0f, 165.0f, 272.0f), pm::Vector3(82.0f, 0.0f, 225.0f));
	short5->setMaterial(white);
	world.addObject(std::move(short5));

	// Tall object
	auto tall1 = rectangleFromVertices(pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(472.0f, 330.0f, 406.0f));
	tall1->setMaterial(white);
	world.addObject(std::move(tall1));

	auto tall2 = rectangleFromVertices(pm::Vector3(423.0f, 0.0f, 247.0f), pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(472.0f, 0.0f, 406.0f));
	tall2->setMaterial(white);
	world.addObject(std::move(tall2));

	auto tall3 = rectangleFromVertices(pm::Vector3(472.0f, 0.0f, 406.0f), pm::Vector3(472.0f, 330.0f, 406.0f), pm::Vector3(314.0f, 0.0f, 456.0f));
	tall3->setMaterial(white);
	world.addObject(std::move(tall3));

	auto tall4 = rectangleFromVertices(pm::Vector3(314.0f, 0.0f, 456.0f), pm::Vector3(314.0f, 330.0f, 456.0f), pm::Vector3(265.0f, 0.0f, 296.0f));
	tall4->setMaterial(white);
	world.addObject(std::move(tall4));

	auto tall5 = rectangleFromVertices(pm::Vector3(265.0f, 0.0f, 296.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(423.0f, 0.0f, 247.0f));
	tall5->setMaterial(white);
	world.addObject(std::move(tall5));
}